

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

void Abc_SclLinkCells(SC_Lib *p)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  void **ppvVar4;
  undefined8 *__ptr;
  long *__base;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  void *pvVar11;
  size_t sVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  if ((p->vCellClasses).nSize != 0) {
    __assert_fail("Vec_PtrSize(&p->vCellClasses) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                  ,0x10b,"void Abc_SclLinkCells(SC_Lib *)");
  }
  iVar3 = (p->vCells).nSize;
  uVar16 = 0;
  if (0 < iVar3) {
    lVar17 = 0;
    pvVar11 = (void *)0x0;
    do {
      pvVar9 = (p->vCells).pArray[lVar17];
      iVar14 = (int)uVar16;
      if (iVar14 < 1) {
        uVar6 = 0;
LAB_003efecc:
        if ((int)uVar6 == iVar14) goto LAB_003efed1;
        lVar7 = *(long *)((long)pvVar11 + 0x50);
        *(void **)(lVar7 + 0x48) = pvVar9;
        *(void **)((long)pvVar9 + 0x48) = pvVar11;
        *(long *)((long)pvVar9 + 0x50) = lVar7;
        *(void **)((long)pvVar11 + 0x50) = pvVar9;
      }
      else {
        uVar15 = *(uint *)((long)pvVar9 + 0x40);
        uVar6 = 0;
        do {
          pvVar11 = (p->vCellClasses).pArray[uVar6];
          if ((uVar15 == *(uint *)((long)pvVar11 + 0x40)) &&
             (*(int *)((long)pvVar9 + 0x44) == *(int *)((long)pvVar11 + 0x44))) {
            if (((int)uVar15 < 0) ||
               ((*(int *)((long)pvVar9 + 0x34) <= (int)uVar15 ||
                (*(int *)((long)pvVar11 + 0x34) <= (int)uVar15)))) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            lVar7 = *(long *)(*(long *)((long)pvVar9 + 0x38) + (ulong)uVar15 * 8);
            lVar2 = *(long *)(*(long *)((long)pvVar11 + 0x38) + (ulong)uVar15 * 8);
            uVar1 = *(uint *)(lVar7 + 0x34);
            if (uVar1 == *(uint *)(lVar2 + 0x34)) {
              if ((int)uVar1 < 1) goto LAB_003efecc;
              uVar10 = 0;
              while (*(long *)(*(long *)(lVar7 + 0x38) + uVar10 * 8) ==
                     *(long *)(*(long *)(lVar2 + 0x38) + uVar10 * 8)) {
                uVar10 = uVar10 + 1;
                if (uVar1 == uVar10) goto LAB_003efecc;
              }
            }
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar16);
LAB_003efed1:
        if (iVar14 == (p->vCellClasses).nCap) {
          if (iVar14 < 0x10) {
            ppvVar4 = (p->vCellClasses).pArray;
            if (ppvVar4 == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(ppvVar4,0x80);
            }
            (p->vCellClasses).pArray = ppvVar4;
            (p->vCellClasses).nCap = 0x10;
          }
          else {
            ppvVar4 = (p->vCellClasses).pArray;
            sVar12 = (ulong)(uint)(iVar14 * 2) * 8;
            if (ppvVar4 == (void **)0x0) {
              ppvVar4 = (void **)malloc(sVar12);
            }
            else {
              ppvVar4 = (void **)realloc(ppvVar4,sVar12);
            }
            (p->vCellClasses).pArray = ppvVar4;
            (p->vCellClasses).nCap = iVar14 * 2;
          }
        }
        else {
          ppvVar4 = (p->vCellClasses).pArray;
        }
        iVar3 = (p->vCellClasses).nSize;
        uVar15 = iVar3 + 1;
        uVar16 = (ulong)uVar15;
        (p->vCellClasses).nSize = uVar15;
        ppvVar4[iVar3] = pvVar9;
        *(void **)((long)pvVar9 + 0x50) = pvVar9;
        *(void **)((long)pvVar9 + 0x48) = pvVar9;
        iVar3 = (p->vCells).nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar3);
    uVar16 = (ulong)(int)uVar16;
  }
  qsort((p->vCellClasses).pArray,uVar16,8,Abc_SclCompareCells);
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 100;
  __base = (long *)malloc(800);
  __ptr[1] = __base;
  if ((p->vCellClasses).nSize < 1) {
    if (__base == (long *)0x0) goto LAB_003f0144;
  }
  else {
    uVar16 = 100;
    lVar17 = 0;
    do {
      pvVar11 = (p->vCellClasses).pArray[lVar17];
      sVar12 = 0;
      uVar10 = 0;
      pvVar9 = pvVar11;
      uVar6 = 0;
      do {
        uVar13 = uVar6;
        if (uVar13 == uVar16) {
          pvVar5 = (void *)__ptr[1];
          if (uVar13 < 0x10) {
            if (pvVar5 == (void *)0x0) {
              pvVar5 = malloc(0x80);
            }
            else {
              pvVar5 = realloc(pvVar5,0x80);
            }
            __ptr[1] = pvVar5;
            uVar16 = 0x10;
          }
          else {
            if (pvVar5 == (void *)0x0) {
              pvVar5 = malloc(sVar12);
            }
            else {
              pvVar5 = realloc(pvVar5,sVar12);
            }
            __ptr[1] = pvVar5;
            uVar16 = uVar10;
          }
        }
        else {
          pvVar5 = (void *)__ptr[1];
        }
        uVar6 = uVar13 + 1;
        *(void **)((long)pvVar5 + uVar13 * 8) = pvVar9;
        pvVar9 = *(void **)((long)pvVar9 + 0x48);
        uVar10 = (ulong)((int)uVar10 + 2);
        sVar12 = sVar12 + 0x10;
      } while (pvVar9 != pvVar11);
      __base = (long *)__ptr[1];
      qsort(__base,uVar6,8,Abc_SclCompareCells);
      pvVar11 = (void *)*__base;
      *(void **)((long)pvVar11 + 0x50) = pvVar11;
      *(void **)((long)pvVar11 + 0x48) = pvVar11;
      *(void **)((long)pvVar11 + 0x58) = pvVar11;
      uVar10 = uVar6 >> 1 & 0x7fffffff;
      *(long *)((long)pvVar11 + 0x60) = __base[uVar10];
      *(undefined4 *)((long)pvVar11 + 0x68) = 0;
      *(int *)((long)pvVar11 + 0x6c) = (int)uVar6;
      if (uVar6 != 1) {
        uVar8 = 0;
        pvVar9 = pvVar11;
        do {
          pvVar5 = (void *)__base[uVar8 + 1];
          *(void **)((long)pvVar9 + 0x48) = pvVar5;
          *(void **)((long)pvVar5 + 0x48) = pvVar11;
          *(void **)((long)pvVar5 + 0x50) = pvVar9;
          *(void **)((long)pvVar11 + 0x50) = pvVar5;
          *(void **)((long)pvVar5 + 0x58) = pvVar11;
          *(long *)((long)pvVar5 + 0x60) = __base[uVar10];
          uVar8 = uVar8 + 1;
          *(int *)((long)pvVar5 + 0x68) = (int)uVar8;
          *(int *)((long)pvVar5 + 0x6c) = (int)uVar6;
          pvVar9 = pvVar5;
        } while (uVar13 != uVar8);
      }
      lVar7 = (long)(p->vCellClasses).nSize;
      if (lVar7 <= lVar17) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      (p->vCellClasses).pArray[lVar17] = pvVar11;
      lVar17 = lVar17 + 1;
    } while (lVar17 < lVar7);
  }
  free(__base);
LAB_003f0144:
  free(__ptr);
  return;
}

Assistant:

void Abc_SclLinkCells( SC_Lib * p )
{
    Vec_Ptr_t * vList;
    SC_Cell * pCell, * pRepr = NULL;
    int i, k;
    assert( Vec_PtrSize(&p->vCellClasses) == 0 );
    SC_LibForEachCell( p, pCell, i )
    {
        // find gate with the same function
        SC_LibForEachCellClass( p, pRepr, k )
            if ( pCell->n_inputs  == pRepr->n_inputs && 
                 pCell->n_outputs == pRepr->n_outputs && 
                 Vec_WrdEqual(SC_CellFunc(pCell), SC_CellFunc(pRepr)) )
                break;
        if ( k == Vec_PtrSize(&p->vCellClasses) )
        {
            Vec_PtrPush( &p->vCellClasses, pCell );
            pCell->pNext = pCell->pPrev = pCell;
            continue;
        }
        // add it to the list before the cell
        pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
        pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
    }
    // sort cells by size then by name
    qsort( (void *)Vec_PtrArray(&p->vCellClasses), Vec_PtrSize(&p->vCellClasses), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
    // sort cell lists
    vList = Vec_PtrAlloc( 100 );
    SC_LibForEachCellClass( p, pRepr, k )
    {
        Vec_PtrClear( vList );
        SC_RingForEachCell( pRepr, pCell, i )
            Vec_PtrPush( vList, pCell );
        qsort( (void *)Vec_PtrArray(vList), Vec_PtrSize(vList), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
        // create new representative
        pRepr = (SC_Cell *)Vec_PtrEntry( vList, 0 );
        pRepr->pNext = pRepr->pPrev = pRepr;
        pRepr->pRepr = pRepr;
        pRepr->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
        pRepr->Order = 0;
        pRepr->nGates = Vec_PtrSize(vList);
        // relink cells
        Vec_PtrForEachEntryStart( SC_Cell *, vList, pCell, i, 1 )
        {
            pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
            pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
            pCell->pRepr = pRepr;
            pCell->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
            pCell->Order = i;
            pCell->nGates = Vec_PtrSize(vList);
        }
        // update list
        Vec_PtrWriteEntry( &p->vCellClasses, k, pRepr );
    }
    Vec_PtrFree( vList );
}